

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_api_loader.cpp
# Opt level: O2

int lua_upvalueindex(int i)

{
  int iVar1;
  
  iVar1 = -0x2712;
  if (luaVersion - LUA_52 < 3) {
    iVar1 = -0xf4628;
  }
  return iVar1 - i;
}

Assistant:

int lua_upvalueindex(int i)
{
	if (luaVersion == LuaVersion::LUA_54)
		return -1001000 - i;
	if (luaVersion == LuaVersion::LUA_53)
		return -1001000 - i;
	if (luaVersion == LuaVersion::LUA_52)
		return -1001000 - i;
	return -10002 - i;
}